

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O0

void __thiscall Container::open_files(Container *this)

{
  bool bVar1;
  int iVar2;
  TaskData *pTVar3;
  pointer pvVar4;
  ContextManager *pCVar5;
  string local_80;
  string local_60;
  string local_30;
  Container *local_10;
  Container *this_local;
  
  local_10 = this;
  pTVar3 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
  bVar1 = PlainString<4096UL>::empty(&(pTVar3->stdin_desc).filename);
  if (!bVar1) {
    pTVar3 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
    pvVar4 = PlainString<4096UL>::c_str(&(pTVar3->stdin_desc).filename);
    iVar2 = open(pvVar4,0);
    pTVar3 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
    (pTVar3->stdin_desc).fd = iVar2;
    pTVar3 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
    if ((pTVar3->stdin_desc).fd < 0) {
      pCVar5 = ContextManager::get();
      pTVar3 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
      pvVar4 = PlainString<4096UL>::c_str(&(pTVar3->stdin_desc).filename);
      format_abi_cxx11_(&local_30,"Cannot open \'%s\': %m",pvVar4);
      (**pCVar5->_vptr_ContextManager)(pCVar5,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
    }
  }
  pTVar3 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
  bVar1 = PlainString<4096UL>::empty(&(pTVar3->stdout_desc).filename);
  if (!bVar1) {
    pTVar3 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
    pvVar4 = PlainString<4096UL>::c_str(&(pTVar3->stdout_desc).filename);
    iVar2 = open(pvVar4,0x201);
    pTVar3 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
    (pTVar3->stdout_desc).fd = iVar2;
    pTVar3 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
    if ((pTVar3->stdout_desc).fd < 0) {
      pCVar5 = ContextManager::get();
      pTVar3 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
      pvVar4 = PlainString<4096UL>::c_str(&(pTVar3->stdout_desc).filename);
      format_abi_cxx11_(&local_60,"Cannot open \'%s\': %m",pvVar4);
      (**pCVar5->_vptr_ContextManager)(pCVar5,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
    }
  }
  pTVar3 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
  bVar1 = PlainString<4096UL>::empty(&(pTVar3->stderr_desc).filename);
  if (!bVar1) {
    pTVar3 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
    pvVar4 = PlainString<4096UL>::c_str(&(pTVar3->stderr_desc).filename);
    iVar2 = open(pvVar4,0x201);
    pTVar3 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
    (pTVar3->stderr_desc).fd = iVar2;
    pTVar3 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
    if ((pTVar3->stderr_desc).fd < 0) {
      pCVar5 = ContextManager::get();
      pTVar3 = SharedMemoryObject<TaskData>::operator->(&this->task_data_);
      pvVar4 = PlainString<4096UL>::c_str(&(pTVar3->stderr_desc).filename);
      format_abi_cxx11_(&local_80,"Cannot open \'%s\': %m",pvVar4);
      (**pCVar5->_vptr_ContextManager)(pCVar5,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
    }
  }
  return;
}

Assistant:

void Container::open_files() {
    if (!task_data_->stdin_desc.filename.empty()) {
        task_data_->stdin_desc.fd = open(task_data_->stdin_desc.filename.c_str(), O_RDONLY);
        if (task_data_->stdin_desc.fd < 0) {
            die(format("Cannot open '%s': %m", task_data_->stdin_desc.filename.c_str()));
        }
    }

    if (!task_data_->stdout_desc.filename.empty()) {
        task_data_->stdout_desc.fd =
            open(task_data_->stdout_desc.filename.c_str(), O_WRONLY | O_TRUNC);
        if (task_data_->stdout_desc.fd < 0) {
            die(format("Cannot open '%s': %m", task_data_->stdout_desc.filename.c_str()));
        }
    }

    if (!task_data_->stderr_desc.filename.empty()) {
        task_data_->stderr_desc.fd = open(task_data_->stderr_desc.filename.c_str(), O_WRONLY | O_TRUNC);
        if (task_data_->stderr_desc.fd < 0) {
            die(format("Cannot open '%s': %m", task_data_->stderr_desc.filename.c_str()));
        }
    }
}